

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<char>::do_real_put<long_double>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,longdouble val)

{
  long lVar1;
  iter_type out_00;
  iter_type out_01;
  iter_type out_02;
  fmtflags __fmtfl;
  ios_info *this_00;
  uint64_t uVar2;
  streamsize sVar3;
  streambuf_type *psVar4;
  streambuf_type *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 in_RSI;
  long *in_RDI;
  char in_R8B;
  undefined2 in_FPUControlWord;
  iter_type iVar5;
  iter_type iVar6;
  iter_type iVar7;
  string_type *unaff_retaddr;
  unkbyte10 in_stack_00000008;
  bool intl;
  bool nat;
  sstream_type ss;
  ios_info *info;
  iter_type ret_ptr;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  bool bVar8;
  char_type fill_00;
  undefined2 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcda;
  undefined2 in_stack_fffffffffffffcdc;
  undefined2 in_stack_fffffffffffffcde;
  undefined2 in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce2;
  undefined2 in_stack_fffffffffffffce4;
  undefined2 in_stack_fffffffffffffce6;
  streambuf_type *in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  char in_stack_fffffffffffffd10;
  string local_298 [40];
  undefined8 uStack_270;
  undefined8 uStack_250;
  undefined8 uStack_230;
  undefined8 uStack_210;
  streambuf_type *local_208;
  undefined1 local_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  locale local_1d0;
  long local_1c8 [47];
  undefined7 local_48;
  char_type fill_01;
  undefined2 uVar9;
  undefined6 in_stack_ffffffffffffffc2;
  undefined7 in_stack_ffffffffffffffc8;
  long *plVar10;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  streambuf_type *local_10;
  undefined1 local_8;
  
  uStack_18 = CONCAT31(uStack_18._1_3_,in_DL);
  local_48 = (undefined7)in_stack_00000008;
  fill_01 = (char_type)((unkuint10)in_stack_00000008 >> 0x38);
  uVar9 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  plVar10 = in_RDI;
  this_00 = ios_info::get((ios_base *)0x28ca6b);
  uVar2 = ios_info::display_flags(this_00);
  local_20 = (undefined4)in_RSI;
  uStack_1c = (undefined4)((ulong)in_RSI >> 0x20);
  fill_00 = (char_type)(uVar2 >> 0x38);
  switch(uVar2) {
  case 0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::locale::classic();
    std::ios::imbue(&local_1d0);
    std::locale::~locale(&local_1d0);
    lVar1 = *(long *)(local_1c8[0] + -0x18);
    __fmtfl = std::ios_base::flags((ios_base *)in_RCX);
    std::ios_base::flags((ios_base *)((long)local_1c8 + lVar1),__fmtfl);
    lVar1 = *(long *)(local_1c8[0] + -0x18);
    sVar3 = std::ios_base::precision((ios_base *)in_RCX);
    std::ios_base::precision((ios_base *)((long)local_1c8 + lVar1),sVar3);
    lVar1 = *(long *)(local_1c8[0] + -0x18);
    sVar3 = std::ios_base::width((ios_base *)in_RCX);
    std::ios_base::width((ios_base *)((long)local_1c8 + lVar1),sVar3);
    local_1f8 = local_20;
    uStack_1f4 = uStack_1c;
    uStack_1f0 = uStack_18;
    psVar4 = (streambuf_type *)
             std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                       (in_RDI,in_RSI,uStack_18,(long)local_1c8 + *(long *)(local_1c8[0] + -0x18),
                        (int)in_R8B);
    local_208 = psVar4;
    local_200 = extraout_DL;
    std::ios_base::width((ios_base *)in_RCX,0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    iVar6._8_8_ = extraout_RDX;
    iVar6._M_sbuf = psVar4;
    local_8 = extraout_DL;
    break;
  case 1:
  case 3:
  case 8:
  case 9:
  default:
    iVar6 = (iter_type)
            std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                      (in_RDI,in_RSI,uStack_18,in_RCX,(int)in_R8B);
    local_8 = iVar6._M_failed;
    break;
  case 2:
    uVar2 = ios_info::currency_flags(this_00);
    bVar8 = true;
    if (uVar2 != 0) {
      uVar2 = ios_info::currency_flags(this_00);
      bVar8 = uVar2 == 0x40;
    }
    iVar6 = (iter_type)
            (**(code **)(*in_RDI + 0x50))
                      (in_RDI,~bVar8 & 1,in_RSI,uStack_18,in_RCX,(int)in_R8B,
                       CONCAT28(uVar9,CONCAT17(fill_01,local_48)));
    local_8 = iVar6._M_failed;
    break;
  case 4:
    uStack_210 = CONCAT44(uStack_14,uStack_18);
    out_00._8_8_ = in_stack_fffffffffffffcf0;
    out_00._M_sbuf =
         (streambuf_type *)(long)ROUND((longdouble)CONCAT28(uVar9,CONCAT17(fill_01,local_48)));
    iVar6 = format_time((base_num_format<char> *)
                        (CONCAT26(in_FPUControlWord,
                                  CONCAT24(in_FPUControlWord,
                                           CONCAT22(in_stack_fffffffffffffce2,
                                                    in_stack_fffffffffffffce0))) | 0xc0000000000),
                        out_00,(ios_base *)
                               CONCAT26(in_stack_fffffffffffffcde,
                                        CONCAT24(in_stack_fffffffffffffcdc,
                                                 CONCAT22(in_stack_fffffffffffffcda,
                                                          in_stack_fffffffffffffcd8))),fill_00,
                        (time_t)in_RDI,in_stack_fffffffffffffd10);
    local_8 = iVar6._M_failed;
    break;
  case 5:
    uStack_230 = CONCAT44(uStack_14,uStack_18);
    out_01._8_8_ = (long)ROUND((longdouble)CONCAT28(uVar9,CONCAT17(fill_01,local_48)));
    out_01._M_sbuf = in_stack_fffffffffffffce8;
    iVar6 = format_time((base_num_format<char> *)
                        (CONCAT26(in_stack_fffffffffffffce6,
                                  CONCAT24(in_stack_fffffffffffffce4,
                                           CONCAT22(in_FPUControlWord,in_FPUControlWord))) | 0xc00),
                        out_01,(ios_base *)
                               CONCAT26(in_stack_fffffffffffffcde,
                                        CONCAT24(in_stack_fffffffffffffcdc,
                                                 CONCAT22(in_stack_fffffffffffffcda,
                                                          in_stack_fffffffffffffcd8))),fill_00,
                        (time_t)in_RDI,in_stack_fffffffffffffd10);
    local_8 = iVar6._M_failed;
    break;
  case 6:
    uStack_250 = CONCAT44(uStack_14,uStack_18);
    out_02._8_8_ = in_stack_fffffffffffffcf0;
    out_02._M_sbuf = in_stack_fffffffffffffce8;
    iVar6 = format_time((base_num_format<char> *)
                        CONCAT26(in_stack_fffffffffffffce6,
                                 CONCAT24(in_stack_fffffffffffffce4,
                                          CONCAT22(in_stack_fffffffffffffce2,
                                                   in_stack_fffffffffffffce0))),out_02,
                        (ios_base *)
                        (CONCAT26(in_FPUControlWord,
                                  CONCAT24(in_FPUControlWord,
                                           CONCAT22(in_stack_fffffffffffffcda,
                                                    in_stack_fffffffffffffcd8))) | 0xc0000000000),
                        fill_00,(time_t)in_RDI,in_stack_fffffffffffffd10);
    local_8 = iVar6._M_failed;
    break;
  case 7:
    uStack_270 = CONCAT44(uStack_14,uStack_18);
    ios_info::date_time_pattern<char>
              ((ios_info *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    iVar5._8_8_ = plVar10;
    iVar5._M_sbuf = in_RCX;
    iVar5 = format_time((base_num_format<char> *)CONCAT17(in_R8B,in_stack_ffffffffffffffc8),iVar5,
                        (ios_base *)CONCAT62(in_stack_ffffffffffffffc2,uVar9),fill_01,
                        (time_t)this_00,unaff_retaddr);
    local_8 = iVar5._M_failed;
    std::__cxx11::string::~string(local_298);
    iVar6._8_8_ = extraout_RDX_00;
    iVar6._M_sbuf = iVar5._M_sbuf;
  }
  local_10 = iVar6._M_sbuf;
  iVar7._9_7_ = iVar6._9_7_;
  iVar7._M_failed = (bool)local_8;
  iVar7._M_sbuf = local_10;
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }